

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128crc.cpp
# Opt level: O1

void metrohash128crc_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  puVar1 = (uint *)(key + len);
  lVar8 = (ulong)seed * 0x2e4b2e1b;
  uVar2 = len + 0xd4e05ca6945fff0b + lVar8;
  lVar4 = (ulong)seed * 0x797a90bb;
  uVar6 = len + 0x521b836fec4d4761 + lVar4;
  if (0x1f < len) {
    uVar7 = lVar4 + len + 0x71290183ae35dc55;
    uVar5 = lVar8 + len + 0xe0b5ca3d59cada7f;
    do {
      uVar3 = crc32(uVar2,*(undefined8 *)key);
      uVar2 = uVar3 ^ uVar2;
      uVar3 = crc32(uVar6,*(undefined8 *)((long)key + 8));
      uVar6 = uVar3 ^ uVar6;
      uVar3 = crc32(uVar7,*(undefined8 *)((long)key + 0x10));
      uVar7 = uVar3 ^ uVar7;
      uVar3 = crc32(uVar5,*(undefined8 *)((long)key + 0x18));
      uVar5 = uVar3 ^ uVar5;
      key = (uint8_t *)((long)key + 0x20);
    } while (key <= puVar1 + -8);
    uVar3 = (uVar5 + uVar2) * 0xee783e2f + uVar6;
    uVar7 = (uVar3 >> 0xc | uVar3 << 0x34) * 0xad07c493 ^ uVar7;
    uVar3 = (uVar7 + uVar6) * 0xad07c493 + uVar2;
    uVar5 = (uVar3 >> 0x13 | uVar3 << 0x2d) * 0xee783e2f ^ uVar5;
    uVar3 = (uVar7 + uVar2) * 0xee783e2f + uVar5;
    uVar2 = uVar2 ^ (uVar3 >> 0xc | uVar3 << 0x34) * 0xad07c493;
    uVar7 = (uVar5 + uVar6) * 0xad07c493 + uVar7;
    uVar6 = uVar6 ^ (uVar7 >> 0x13 | uVar7 << 0x2d) * 0xee783e2f;
  }
  if (0xf < (long)puVar1 - (long)key) {
    uVar2 = *(long *)key * 0x797a90bb + uVar2;
    uVar2 = uVar2 >> 0x29 | uVar2 * 0x800000;
    uVar6 = *(long *)((long)key + 8) * 0x797a90bb + uVar6;
    key = (uint8_t *)((long)key + 0x10);
    uVar5 = uVar6 >> 0x29 | uVar6 * 0x800000;
    uVar6 = uVar5 * 0x2e4b2e1b;
    uVar7 = uVar2 * 0x15f7b2cad6b7ddb9 + uVar6;
    uVar2 = (uVar7 >> 10 | uVar7 << 0x36) * 0xad07c493 ^ uVar2 * 0x2e4b2e1b;
    uVar7 = uVar5 * 0x85f1aa5c01fb6d9 + uVar2;
    uVar6 = (uVar7 >> 10 | uVar7 << 0x36) * 0xee783e2f ^ uVar6;
  }
  if (7 < (long)puVar1 - (long)key) {
    uVar2 = *(long *)key * 0x797a90bb + uVar2;
    key = (uint8_t *)((long)key + 8);
    uVar2 = uVar2 >> 0x22 | uVar2 * 0x40000000;
    uVar7 = uVar2 * 0x15f7b2cad6b7ddb9 + uVar6;
    uVar2 = (uVar7 >> 0x16 | uVar7 << 0x2a) * 0xad07c493 ^ uVar2 * 0x2e4b2e1b;
  }
  if (3 < (long)puVar1 - (long)key) {
    uVar5 = crc32(uVar2,(ulong)*(uint *)key);
    key = (uint8_t *)((long)key + 4);
    uVar7 = (uVar5 ^ uVar6) * 0x2e4b2e1b + uVar2;
    uVar6 = (uVar7 >> 0xe | uVar7 << 0x32) * 0xee783e2f ^ uVar5 ^ uVar6;
  }
  if (1 < (long)puVar1 - (long)key) {
    uVar5 = crc32(uVar6,(ulong)(ushort)*(uint *)key);
    key = (uint8_t *)((long)key + 2);
    uVar7 = (uVar5 ^ uVar2) * 0x797a90bb + uVar6;
    uVar2 = (uVar7 >> 0xf | uVar7 << 0x31) * 0xad07c493 ^ uVar5 ^ uVar2;
  }
  if (puVar1 != (uint *)key && -1 < (long)puVar1 - (long)key) {
    uVar5 = crc32(uVar2,(ulong)(byte)*(uint *)key);
    uVar7 = (uVar5 ^ uVar6) * 0x2e4b2e1b + uVar2;
    uVar6 = (uVar7 >> 0x12 | uVar7 << 0x2e) * 0xee783e2f ^ uVar5 ^ uVar6;
  }
  uVar7 = uVar2 * 0xee783e2f + uVar6;
  lVar8 = (uVar7 >> 0xf | uVar7 << 0x31) + uVar2;
  uVar2 = uVar6 * 0xad07c493 + lVar8;
  lVar4 = (uVar2 >> 0x1b | uVar2 << 0x25) + uVar6;
  uVar2 = lVar8 * 0xee783e2f + lVar4;
  lVar8 = (uVar2 >> 0xf | uVar2 << 0x31) + lVar8;
  uVar2 = lVar4 * 0xad07c493 + lVar8;
  *(long *)out = lVar8;
  *(ulong *)(out + 8) = (uVar2 >> 0x1b | uVar2 << 0x25) + lVar4;
  return;
}

Assistant:

void metrohash128crc_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xEE783E2F;
    static const uint64_t k1 = 0xAD07C493;
    static const uint64_t k2 = 0x797A90BB;
    static const uint64_t k3 = 0x2E4B2E1B;

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] ^= _mm_crc32_u64(v[0], read_u64(ptr)); ptr += 8;
            v[1] ^= _mm_crc32_u64(v[1], read_u64(ptr)); ptr += 8;
            v[2] ^= _mm_crc32_u64(v[2], read_u64(ptr)); ptr += 8;
            v[3] ^= _mm_crc32_u64(v[3], read_u64(ptr)); ptr += 8;
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 12) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 19) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 12) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 19) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],41) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],41) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 10) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 10) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],34) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 22) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u32(ptr)); ptr += 4;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 14) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] ^= _mm_crc32_u64(v[1], read_u16(ptr)); ptr += 2;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 15) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u8 (ptr));
        v[1] ^= rotate_right((v[1] * k3) + v[0],  18) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 15);
    v[1] += rotate_right((v[1] * k1) + v[0], 27);
    v[0] += rotate_right((v[0] * k0) + v[1], 15);
    v[1] += rotate_right((v[1] * k1) + v[0], 27);

    memcpy(out, v, 16);
}